

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_queue.cpp
# Opt level: O0

span<const_unsigned_char> __thiscall mpt::io::queue::peek(queue *this,size_t len)

{
  bool bVar1;
  uchar *local_38;
  void *base;
  size_t low;
  size_t len_local;
  queue *this_local;
  
  base = (void *)0x0;
  low = len;
  len_local = (size_t)this;
  local_38 = (uchar *)mpt_queue_data(&this->_d,&base);
  if (low == 0) {
    low = (this->_d).len;
  }
  if (base < low) {
    bVar1 = mpt::queue::fragmented(&this->_d);
    if (bVar1) {
      mpt_queue_align(&this->_d,0);
      local_38 = (uchar *)(this->_d).base;
      low = (this->_d).len;
    }
    else {
      low = (this->_d).len;
    }
  }
  else {
    low = (size_t)base;
  }
  span<const_unsigned_char>::span((span<const_unsigned_char> *)&this_local,local_38,low);
  return _this_local;
}

Assistant:

span<const uint8_t> io::queue::peek(size_t len)
{
	size_t low = 0;
	void *base = mpt_queue_data(&_d, &low);
	
	if (!len) len = _d.len;
	
	if (len <= low) {
		len = low;
	}
	else if (!_d.fragmented()) {
		len = _d.len;
	}
	else {
		mpt_queue_align(&_d, 0);
		base = _d.base;
		len = _d.len;
	}
	return span<const uint8_t>(static_cast<uint8_t *>(base), len);
}